

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

CaseInsensitiveMultimap * __thiscall
SimpleWeb::HttpHeader::parse_abi_cxx11_
          (CaseInsensitiveMultimap *__return_storage_ptr__,HttpHeader *this,istream *stream)

{
  ulong uVar1;
  bool bVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  size_t value_start;
  size_t param_end;
  string line;
  istream *stream_local;
  CaseInsensitiveMultimap *result;
  
  line.field_2._M_local_buf[0xf] = '\0';
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_multimap(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&param_end);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&param_end);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&piVar3->_vptr_basic_istream +
                              (long)piVar3->_vptr_basic_istream[-3]));
    bVar6 = false;
    if (bVar2) {
      value_start = std::__cxx11::string::find((char)&param_end,0x3a);
      bVar6 = value_start != 0xffffffffffffffff;
    }
    uVar1 = value_start;
    if (!bVar6) break;
    do {
      local_50 = uVar1 + 1;
      uVar4 = std::__cxx11::string::size();
      bVar6 = false;
      if (uVar1 + 2 < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&param_end);
        bVar6 = *pcVar5 == ' ';
      }
      uVar1 = local_50;
    } while (bVar6);
    uVar4 = std::__cxx11::string::size();
    if (uVar1 < uVar4) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&param_end);
      std::__cxx11::string::size();
      std::__cxx11::string::back();
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&param_end);
      std::
      unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<std::__cxx11::string,std::__cxx11::string>
                ((unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,&local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&param_end);
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_multimap(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static CaseInsensitiveMultimap parse(std::istream &stream) noexcept {
      CaseInsensitiveMultimap result;
      std::string line;
      std::size_t param_end;
      while(getline(stream, line) && (param_end = line.find(':')) != std::string::npos) {
        std::size_t value_start = param_end + 1;
        while(value_start + 1 < line.size() && line[value_start] == ' ')
          ++value_start;
        if(value_start < line.size())
          result.emplace(line.substr(0, param_end), line.substr(value_start, line.size() - value_start - (line.back() == '\r' ? 1 : 0)));
      }
      return result;
    }